

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

bool __thiscall
mjs::anon_unknown_33::has_own_property(anon_unknown_33 *this,object_ptr *o,wstring_view p)

{
  bool bVar1;
  property_attribute a;
  object *this_00;
  object_ptr *o_local;
  wstring_view p_local;
  
  p_local._M_len = p._M_len;
  o_local = o;
  this_00 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)this);
  a = object::own_property_attributes(this_00,(wstring_view *)&o_local);
  bVar1 = is_valid(a);
  return bVar1;
}

Assistant:

bool has_own_property(const object_ptr& o, const std::wstring_view p) {
    return is_valid(o->own_property_attributes(p));
}